

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database_records_calendar_dates.c
# Opt level: O0

void CGTFS_DatabaseCalendarDates(void)

{
  int iVar1;
  greatest_test_res local_c;
  greatest_test_res res;
  
  iVar1 = greatest_test_pre("db_calendar_dates_store");
  if (iVar1 == 1) {
    local_c = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_c == GREATEST_TEST_RES_PASS) {
      local_c = db_calendar_dates_store();
    }
    greatest_test_post(local_c);
  }
  return;
}

Assistant:

SUITE(CGTFS_DatabaseCalendarDates) {
    RUN_TEST(db_calendar_dates_store);
}